

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t init_traditional_PKWARE_decryption(archive_read *a)

{
  wchar_t wVar1;
  char *pcVar2;
  trad_enc_ctx *ctx;
  size_t pw_len;
  uint8_t local_39;
  char *pcStack_38;
  uint8_t crcchk;
  char *passphrase;
  wchar_t r;
  wchar_t retry;
  void *p;
  zip *zip;
  archive_read *a_local;
  
  p = a->format->data;
  if (*(char *)((long)p + 0x1f84) == '\0') {
    zip = (zip *)a;
    if (((*(ushort *)(*(long *)((long)p + 0x70) + 0x7e) & 8) == 0) &&
       (*(long *)((long)p + 0x78) < 0xc)) {
      archive_set_error(&a->archive,0x54,"Truncated Zip encrypted body: only %jd bytes available",
                        *(undefined8 *)((long)p + 0x78));
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      _r = (uint8_t *)__archive_read_ahead(a,0xc,(ssize_t *)0x0);
      if (_r == (uint8_t *)0x0) {
        archive_set_error((archive *)zip,0x54,"Truncated ZIP file data");
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        passphrase._4_4_ = 0;
        while (pcVar2 = __archive_read_next_passphrase((archive_read *)zip), pcStack_38 = pcVar2,
              pcVar2 != (char *)0x0) {
          ctx = (trad_enc_ctx *)((long)p + 0x1f78);
          pw_len = strlen(pcVar2);
          passphrase._0_4_ = trad_enc_init(ctx,pcVar2,pw_len,_r,0xc,&local_39);
          if (((wchar_t)passphrase == L'\0') &&
             (local_39 == *(uint8_t *)(*(long *)((long)p + 0x70) + 0x83))) {
            __archive_read_consume((archive_read *)zip,0xc);
            *(undefined1 *)((long)p + 0x1f84) = 1;
            if ((*(ushort *)(*(long *)((long)p + 0x70) + 0x7e) & 8) == 0) {
              *(long *)((long)p + 0x78) = *(long *)((long)p + 0x78) + -0xc;
            }
            *(long *)((long)p + 0x80) = *(long *)((long)p + 0x80) + 0xc;
            *(undefined8 *)((long)p + 0x1f68) = 0;
            wVar1 = zip_alloc_decryption_buffer((archive_read *)zip);
            return wVar1;
          }
          if (10000 < passphrase._4_4_) {
            archive_set_error((archive *)zip,-1,"Too many incorrect passphrases");
            return L'\xffffffe7';
          }
          passphrase._4_4_ = passphrase._4_4_ + 1;
        }
        pcVar2 = "Passphrase required for this entry";
        if (0 < passphrase._4_4_) {
          pcVar2 = "Incorrect passphrase";
        }
        archive_set_error((archive *)zip,-1,pcVar2);
        a_local._4_4_ = L'\xffffffe7';
      }
    }
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
init_traditional_PKWARE_decryption(struct archive_read *a)
{
	struct zip *zip = (struct zip *)(a->format->data);
	const void *p;
	int retry;
	int r;

	if (zip->tctx_valid)
		return (ARCHIVE_OK);

	/*
	   Read the 12 bytes encryption header stored at
	   the start of the data area.
	 */
#define ENC_HEADER_SIZE	12
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < ENC_HEADER_SIZE) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated Zip encrypted body: only %jd bytes available",
		    (intmax_t)zip->entry_bytes_remaining);
		return (ARCHIVE_FATAL);
	}

	p = __archive_read_ahead(a, ENC_HEADER_SIZE, NULL);
	if (p == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file data");
		return (ARCHIVE_FATAL);
	}

	for (retry = 0;; retry++) {
		const char *passphrase;
		uint8_t crcchk;

		passphrase = __archive_read_next_passphrase(a);
		if (passphrase == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    (retry > 0)?
				"Incorrect passphrase":
				"Passphrase required for this entry");
			return (ARCHIVE_FAILED);
		}

		/*
		 * Initialize ctx for Traditional PKWARE Decryption.
		 */
		r = trad_enc_init(&zip->tctx, passphrase, strlen(passphrase),
			p, ENC_HEADER_SIZE, &crcchk);
		if (r == 0 && crcchk == zip->entry->decdat)
			break;/* The passphrase is OK. */
		if (retry > 10000) {
			/* Avoid infinity loop. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Too many incorrect passphrases");
			return (ARCHIVE_FAILED);
		}
	}

	__archive_read_consume(a, ENC_HEADER_SIZE);
	zip->tctx_valid = 1;
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
	    zip->entry_bytes_remaining -= ENC_HEADER_SIZE;
	}
	/*zip->entry_uncompressed_bytes_read += ENC_HEADER_SIZE;*/
	zip->entry_compressed_bytes_read += ENC_HEADER_SIZE;
	zip->decrypted_bytes_remaining = 0;

	return (zip_alloc_decryption_buffer(a));
#undef ENC_HEADER_SIZE
}